

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O0

int Nf_ManComputeArrival(Nf_Man_t *p,Nf_Mat_t *pM,int *pCutSet)

{
  bool bVar1;
  int iVar2;
  Mio_Cell2_t *pMVar3;
  int *pCut_00;
  int *piVar4;
  Nf_Mat_t *pNVar5;
  int *pCut;
  Mio_Cell2_t *pCell;
  int local_38;
  int k;
  int fCompl;
  int iVar;
  Nf_Mat_t *pMfan;
  int Delay;
  int *pCutSet_local;
  Nf_Mat_t *pM_local;
  Nf_Man_t *p_local;
  
  pMfan._4_4_ = 0;
  pMVar3 = Nf_ManCell(p,*(uint *)pM & 0xfffff);
  pCut_00 = Nf_CutFromHandle(pCutSet,*(uint *)pM >> 0x14 & 0x3ff);
  if ((*(uint *)pM >> 0x1e & 1) == 0) {
    pCell._4_4_ = 0;
    while( true ) {
      iVar2 = Nf_CutSize(pCut_00);
      bVar1 = false;
      if (pCell._4_4_ < iVar2) {
        piVar4 = Nf_CutLeaves(pCut_00);
        iVar2 = Nf_CfgVar(pM->Cfg,pCell._4_4_);
        k = piVar4[iVar2];
        bVar1 = false;
        if (k != 0) {
          local_38 = Nf_CfgCompl(pM->Cfg,pCell._4_4_);
          bVar1 = true;
        }
      }
      if (!bVar1) break;
      pNVar5 = Nf_ObjMatchBest(p,k,local_38);
      pMfan._4_4_ = Abc_MaxInt(pMfan._4_4_,pNVar5->D + pMVar3->iDelays[pCell._4_4_]);
      pCell._4_4_ = pCell._4_4_ + 1;
    }
    return pMfan._4_4_;
  }
  __assert_fail("!pM->fCompl",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaNf.c"
                ,0x738,"int Nf_ManComputeArrival(Nf_Man_t *, Nf_Mat_t *, int *)");
}

Assistant:

int Nf_ManComputeArrival( Nf_Man_t * p, Nf_Mat_t * pM, int * pCutSet )
{
    int Delay = 0; 
    Nf_Mat_t * pMfan;
    int iVar, fCompl, k;
    Mio_Cell2_t * pCell = Nf_ManCell( p, pM->Gate );
    int * pCut = Nf_CutFromHandle( pCutSet, pM->CutH );
    assert( !pM->fCompl );
    Nf_CutForEachVarCompl( pCut, pM->Cfg, iVar, fCompl, k )
    {
        pMfan = Nf_ObjMatchBest( p, iVar, fCompl );
        Delay = Abc_MaxInt( Delay, pMfan->D + pCell->iDelays[k] );
    }
    //if ( pM->fCompl ) Delay += p->InvDelayI;
    return Delay;
}